

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void diy::
     reduce<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>,diy::RegularSwapPartners,diy::detail::SkipIntermediate>
               (Master *master,Assigner *assigner,RegularSwapPartners *partners,
               AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *reduce,
               SkipIntermediate *skip)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  element_type *peVar7;
  size_type sVar8;
  Master *in_RDX;
  Master *in_RDI;
  SkipIntermediate *in_R8;
  vector<int,_std::allocator<int>_> incoming_gids;
  uint i;
  int expected;
  uint round;
  int original_expected;
  shared_ptr<diy::spd::logger> log;
  Master *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  uint uVar9;
  Master *in_stack_fffffffffffffd18;
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *in_stack_fffffffffffffd20;
  Master *in_stack_fffffffffffffd28;
  IncomingQueues *in_stack_fffffffffffffd30;
  Master *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  ReductionFunctor<void,_diy::RegularSwapPartners> *in_stack_fffffffffffffd48;
  Master *in_stack_fffffffffffffd50;
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate> local_280 [7];
  MemoryManagement *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe3f;
  Master *in_stack_fffffffffffffe40;
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  local_1a8;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  vector<int,_std::allocator<int>_> local_148;
  uint local_130;
  int local_12c;
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate> local_128 [2];
  Master *in_stack_ffffffffffffff08;
  uint local_40;
  int local_3c;
  SkipIntermediate *local_28;
  Master *local_18;
  Master *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  get_logger();
  local_3c = Master::expected(local_8);
  local_40 = 0;
  while( true ) {
    uVar5 = (ulong)local_40;
    sVar6 = RegularPartners::rounds((RegularPartners *)0x1bc034);
    iVar3 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    if (sVar6 <= uVar5) break;
    peVar7 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1bc052);
    spd::logger::debug<unsigned_int>(peVar7,"Round {}",&local_40);
    std::function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)>::
    function<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>const&,void>
              ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                *)in_stack_fffffffffffffd20,
               (AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *)
               in_stack_fffffffffffffd18);
    detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
              ((ReductionFunctor<void,_diy::RegularSwapPartners> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(Callback *)in_stack_fffffffffffffd30
               ,(RegularSwapPartners *)in_stack_fffffffffffffd28,
               (Assigner *)in_stack_fffffffffffffd20);
    detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate>::SkipInactiveOr
              (local_128,local_40,(RegularSwapPartners *)local_18,local_28);
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::RegularSwapPartners,diy::detail::SkipIntermediate>,void>
              ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffd20,
               (SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate> *)
               in_stack_fffffffffffffd18);
    Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (Skip *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x1bc129);
    detail::ReductionFunctor<void,_diy::RegularSwapPartners>::~ReductionFunctor
              ((ReductionFunctor<void,_diy::RegularSwapPartners> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::
    ~function((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)> *
              )0x1bc143);
    Master::execute(in_stack_ffffffffffffff08);
    local_12c = 0;
    for (local_130 = 0; uVar9 = local_130, uVar2 = Master::size((Master *)0x1bc180), uVar9 < uVar2;
        local_130 = local_130 + 1) {
      iVar3 = local_40 + 1;
      in_stack_fffffffffffffd50 = local_18;
      iVar4 = Master::gid((Master *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                          (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      bVar1 = RegularSwapPartners::active
                        ((RegularSwapPartners *)in_stack_fffffffffffffd50,iVar3,iVar4,local_8);
      if (bVar1) {
        in_stack_fffffffffffffd48 = (ReductionFunctor<void,_diy::RegularSwapPartners> *)&local_148;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1bc1f8);
        in_stack_fffffffffffffd44 = local_40 + 1;
        in_stack_fffffffffffffd38 = local_18;
        Master::gid((Master *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                    (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        RegularSwapPartners::incoming
                  ((RegularSwapPartners *)in_stack_fffffffffffffd20,
                   (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),(int)in_stack_fffffffffffffd18,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08);
        sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_148);
        local_12c = local_12c + (int)sVar8;
        in_stack_fffffffffffffd28 = local_8;
        Master::gid((Master *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                    (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        in_stack_fffffffffffffd30 =
             Master::incoming((Master *)
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear(in_stack_fffffffffffffd20);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
      }
    }
    Master::set_expected(local_8,local_12c);
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_1a8.mutex_.mLock = 0;
    local_1a8._52_4_ = 0;
    uStack_170 = 0;
    local_1a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1a8.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_1a8.map_._M_t._M_impl._0_8_ = 0;
    local_1a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a8.map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    in_stack_fffffffffffffd20 = &local_1a8;
    in_stack_fffffffffffffd18 = local_8;
    MemoryManagement::MemoryManagement
              ((MemoryManagement *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    Master::flush(in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f,
                  in_stack_fffffffffffffe30);
    MemoryManagement::~MemoryManagement
              ((MemoryManagement *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    local_40 = local_40 + 1;
  }
  peVar7 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bc440);
  spd::logger::debug<unsigned_int>(peVar7,"Round {}",&local_40);
  uVar9 = local_40;
  std::function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)>::
  function<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>const&,void>
            ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)> *)
             in_stack_fffffffffffffd20,
             (AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *)in_stack_fffffffffffffd18
            );
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
            ((ReductionFunctor<void,_diy::RegularSwapPartners> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),iVar3,
             (Callback *)in_stack_fffffffffffffd30,(RegularSwapPartners *)in_stack_fffffffffffffd28,
             (Assigner *)in_stack_fffffffffffffd20);
  detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate>::SkipInactiveOr
            (local_280,local_40,(RegularSwapPartners *)local_18,local_28);
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::RegularSwapPartners,diy::detail::SkipIntermediate>,void>
            ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffd20,
             (SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::SkipIntermediate> *)
             in_stack_fffffffffffffd18);
  Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (Skip *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x1bc50f);
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::~ReductionFunctor
            ((ReductionFunctor<void,_diy::RegularSwapPartners> *)
             CONCAT44(uVar9,in_stack_fffffffffffffd10));
  std::function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::
  ~function((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)> *)
            0x1bc529);
  Master::set_expected(local_8,local_3c);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x1bc54a);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}